

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

bool s2textformat::MakeLaxPolygon
               (string_view str,
               unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_> *lax_polygon)

{
  string_view y;
  string_view x;
  bool bVar1;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices;
  char in_R8B;
  string_view str_00;
  string_view sVar2;
  unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_> local_138;
  uint local_12c;
  s2textformat *local_128;
  char *pcStack_120;
  undefined1 local_110 [8];
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> points;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *local_f0;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> local_d8 [2];
  string_view local_a8;
  char *local_98;
  size_type sStack_90;
  string_view *local_88;
  string_view *loop_str;
  iterator __end1;
  iterator __begin1;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *__range1;
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  loops;
  undefined1 local_40 [8];
  vector<absl::string_view,_std::allocator<absl::string_view>_> loop_strs;
  unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_> *lax_polygon_local;
  string_view str_local;
  
  loops.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)str.ptr_;
  sVar2.length_ = 0x3b;
  sVar2.ptr_ = (char *)str.length_;
  loop_strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)lax_polygon;
  SplitString((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_40,
              (s2textformat *)
              loops.
              super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar2,in_R8B);
  std::
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ::vector((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
            *)&__range1);
  __end1 = std::vector<absl::string_view,_std::allocator<absl::string_view>_>::begin
                     ((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_40);
  loop_str = (string_view *)
             std::vector<absl::string_view,_std::allocator<absl::string_view>_>::end
                       ((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_40);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
                                     *)&loop_str), bVar1) {
    local_88 = __gnu_cxx::
               __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
               ::operator*(&__end1);
    local_98 = local_88->ptr_;
    sStack_90 = local_88->length_;
    absl::string_view::string_view(&local_a8,"full");
    x.length_ = sStack_90;
    x.ptr_ = local_98;
    bVar1 = absl::operator==(x,local_a8);
    if (bVar1) {
      local_d8[0].super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8[0].super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8[0].super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector(local_d8);
      std::
      vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
      ::push_back((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                   *)&__range1,local_d8);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector(local_d8);
    }
    else {
      sVar2 = *local_88;
      absl::string_view::string_view
                ((string_view *)
                 &points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,"empty");
      y.length_ = (size_type)local_f0;
      y.ptr_ = (char *)points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
      vertices = local_f0;
      bVar1 = absl::operator!=(sVar2,y);
      if (bVar1) {
        std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
                  ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_110);
        local_128 = (s2textformat *)local_88->ptr_;
        pcStack_120 = (char *)local_88->length_;
        str_00.length_ = (size_type)local_110;
        str_00.ptr_ = pcStack_120;
        bVar1 = ParsePoints(local_128,str_00,vertices);
        if (bVar1) {
          std::
          vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
          ::push_back((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                       *)&__range1,(value_type *)local_110);
        }
        else {
          str_local.length_._7_1_ = 0;
        }
        local_12c = (uint)!bVar1;
        std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
                  ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_110);
        if (local_12c != 0) goto LAB_0050fd50;
      }
    }
    __gnu_cxx::
    __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
    ::operator++(&__end1);
  }
  absl::
  make_unique<S2LaxPolygonShape,std::vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>&>
            ((absl *)&local_138,
             (vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
              *)&__range1);
  std::unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>::operator=
            ((unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_> *)
             loop_strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,&local_138);
  std::unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>::~unique_ptr
            (&local_138);
  str_local.length_._7_1_ = 1;
  local_12c = 1;
LAB_0050fd50:
  std::
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ::~vector((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
             *)&__range1);
  std::vector<absl::string_view,_std::allocator<absl::string_view>_>::~vector
            ((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_40);
  return (bool)(str_local.length_._7_1_ & 1);
}

Assistant:

bool MakeLaxPolygon(string_view str,
                    unique_ptr<S2LaxPolygonShape>* lax_polygon) {
  vector<string_view> loop_strs = SplitString(str, ';');
  vector<vector<S2Point>> loops;
  for (const auto& loop_str : loop_strs) {
    if (loop_str == "full") {
      loops.push_back(vector<S2Point>());
    } else if (loop_str != "empty") {
      vector<S2Point> points;
      if (!ParsePoints(loop_str, &points)) return false;
      loops.push_back(points);
    }
  }
  *lax_polygon = make_unique<S2LaxPolygonShape>(loops);
  return true;
}